

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

OBS_TYPE __thiscall
despot::Parser::GetObservation
          (Parser *this,vector<int,_std::allocator<int>_> *state,ACT_TYPE action,double *random)

{
  pointer piVar1;
  pointer piVar2;
  pointer pNVar3;
  _func_int **pp_Var4;
  long lVar5;
  CPT *pCVar6;
  int iVar7;
  long lVar8;
  OBS_TYPE OVar9;
  int *piVar10;
  long lVar11;
  int o;
  ulong uVar12;
  
  piVar1 = (state->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar2 = (state->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  piVar10 = &(((this->curr_state_vars_).
               super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>._M_impl.
               super__Vector_impl_data._M_start)->super_NamedVar).super_Variable.curr_value;
  for (lVar11 = 0; (long)piVar2 - (long)piVar1 >> 2 != lVar11; lVar11 = lVar11 + 1) {
    *piVar10 = piVar1[lVar11];
    piVar10 = piVar10 + 0x30;
  }
  (((this->action_vars_).super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>.
    _M_impl.super__Vector_impl_data._M_start)->super_Variable).curr_value = action;
  lVar11 = 2;
  uVar12 = 0;
  OVar9 = 0;
  while( true ) {
    pNVar3 = (this->obs_vars_).
             super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar8 = (long)(this->obs_vars_).
                  super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pNVar3;
    if ((ulong)(lVar8 / 0x78) <= uVar12) break;
    pp_Var4 = (&(pNVar3->super_Variable)._vptr_Variable)[lVar11];
    lVar5 = *(long *)((long)pNVar3 + lVar11 * 8 + -8);
    pCVar6 = (this->obs_funcs_).super__Vector_base<despot::CPT_*,_std::allocator<despot::CPT_*>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar12];
    iVar7 = (*(pCVar6->super_Function)._vptr_Function[0xe])(pCVar6,random,lVar8 % 0x78);
    OVar9 = (long)iVar7 + (long)(int)((ulong)((long)pp_Var4 - lVar5) >> 5) * OVar9;
    uVar12 = uVar12 + 1;
    lVar11 = lVar11 + 0xf;
  }
  return OVar9;
}

Assistant:

OBS_TYPE Parser::GetObservation(const vector<int>& state, ACT_TYPE action,
	double& random) const {
	for (int s = 0; s < state.size(); s++) {
		curr_state_vars_[s].curr_value = state[s];
	}
	action_vars_[0].curr_value = action;

	OBS_TYPE obs = 0;
	for (int o = 0; o < obs_vars_.size(); o++) {
		obs = obs * obs_vars_[o].Size()
			+ obs_funcs_[o]->ComputeCurrentIndex(random);
	}
	return obs;
}